

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               *visited)

{
  Symbol **__x;
  bool bVar1;
  uint uVar2;
  insert_type *x_00;
  equal_to<const_slang::ast::Symbol_*> *this;
  Symbol **__y;
  reference ppTVar3;
  size_type *psVar4;
  insert_type *x_01;
  Type *pTVar5;
  SmallVectorBase<const_slang::ast::Type_*> *in_RDX;
  ClassType *in_RSI;
  long in_RDI;
  Type *base;
  Type *iface;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2;
  alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
  x_1;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  Symbol **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  ClassType *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *in_stack_fffffffffffffbe8;
  Symbol **in_stack_fffffffffffffbf0;
  Symbol **in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  Symbol **in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_338;
  Type *local_320;
  Type **local_318;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_310;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> local_308;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *local_2f8;
  bool in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd31;
  SmallVectorBase<const_slang::ast::Type_*> *pSVar6;
  bool local_259 [25];
  iterator local_240;
  bool local_229 [25];
  iterator local_210;
  bool local_1f9;
  iterator local_1f8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
  local_1e8;
  size_t local_1d0;
  size_t local_1c8;
  Symbol **local_1c0;
  element_type *local_1b8;
  size_type *local_1b0;
  uint local_1a4;
  value_type *local_1a0;
  value_type *local_198;
  uint local_18c;
  group_type *local_188;
  size_t local_180;
  pow2_quadratic_prober local_178;
  size_t local_168;
  size_t local_160;
  Symbol **local_158;
  size_type *local_150;
  Type **local_128;
  size_type *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  Symbol **local_78;
  element_type *local_70;
  size_type *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  size_type *local_8;
  
  if ((*(byte *)(in_RDI + 0x91) & 1) != 0) {
    pSVar6 = in_RDX;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
    ::al((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
          *)0x3f9e1d);
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
    ::alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
                *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               (StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL> *)in_stack_fffffffffffffbd8,
               (ClassType **)0x3f9e3d);
    x_00 = boost::unordered::detail::foa::
           alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
           ::value((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
                    *)0x3f9e4a);
    local_1b8 = boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>::move
                          (x_00);
    local_1b0 = &in_RDX[1].len;
    local_1c0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                ::key_from<slang::ast::Symbol_const*>((Symbol **)0x3f9ea8);
    local_1c8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                ::hash_for<slang::ast::Symbol_const*>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                            *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                           (Symbol **)in_stack_fffffffffffffbd8);
    local_1d0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                                *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                               (size_t)in_stack_fffffffffffffbd8);
    local_158 = local_1c0;
    local_168 = local_1c8;
    local_160 = local_1d0;
    local_150 = &in_RDX[1].len;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_178,local_1d0);
    do {
      local_180 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_178);
      local_188 = boost::unordered::detail::foa::
                  table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  ::groups((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                            *)0x3f9fab);
      local_188 = local_188 + local_180;
      local_18c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffbe8,
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      if (local_18c != 0) {
        local_198 = boost::unordered::detail::foa::
                    table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                    ::elements((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                                *)0x3fa00d);
        local_1a0 = local_198 + local_180 * 0xf;
        do {
          local_1a4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          this = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                         *)0x3fa060);
          __x = local_158;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                ::key_from<slang::ast::Symbol_const*>((Symbol **)0x3fa090);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this,__x,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
            ::table_locator(&local_1e8,local_188,local_1a4,local_1a0 + local_1a4);
            goto LAB_003fa1a6;
          }
          local_18c = local_18c - 1 & local_18c;
        } while (local_18c != 0);
      }
      in_stack_fffffffffffffc57 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (size_t)in_stack_fffffffffffffbd8);
      if ((bool)in_stack_fffffffffffffc57) {
        memset(&local_1e8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
        ::table_locator(&local_1e8);
        goto LAB_003fa1a6;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_178,*(size_t *)in_RDX[1].firstElement);
    } while (bVar1);
    memset(&local_1e8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
    ::table_locator(&local_1e8);
LAB_003fa1a6:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_1e8);
    if (bVar1) {
      local_1f8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  ::make_iterator((locator *)0x3fa1c8);
      local_1f9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffd20,&local_1f8,&local_1f9);
      in_RDX = pSVar6;
    }
    else if (*(ulong *)in_RDX[2].firstElement < in_RDX[2].cap) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_at<slang::ast::Symbol_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (size_t)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0,
                 (Symbol **)in_stack_fffffffffffffbe8);
      local_210 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  ::make_iterator((locator *)0x3fa250);
      local_229[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffd20,&local_210,local_229);
      in_RDX = pSVar6;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      local_240 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  ::make_iterator((locator *)0x3fa2bb);
      local_259[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffd20,&local_240,local_259);
      in_RDX = pSVar6;
    }
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
    ::~alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::ClassType_*>
                *)0x3fa332);
    if ((in_stack_fffffffffffffd30 & 1U) != 0) {
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)
                 CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                 (Type **)in_stack_fffffffffffffbd8);
    }
  }
  local_308 = ClassType::getImplementedInterfaces(in_stack_fffffffffffffbd8);
  local_2f8 = &local_308;
  local_310._M_current =
       (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                          ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
                           in_stack_fffffffffffffbd8);
  local_318 = (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end
                                 (in_stack_fffffffffffffbe8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffbd8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pTVar5 = ClassType::getBaseClass
                         ((ClassType *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                         );
      if ((pTVar5 != (Type *)0x0) && (bVar1 = Type::isError((Type *)0x3fa94f), !bVar1)) {
        Type::getCanonicalType
                  ((Type *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
        Symbol::as<slang::ast::ClassType>((Symbol *)0x3fa968);
        findIfaces(in_RSI,in_RDX,
                   (SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                    *)CONCAT71(in_stack_fffffffffffffd31,in_stack_fffffffffffffd30));
      }
      return;
    }
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
              ::operator*(&local_310);
    local_320 = *ppTVar3;
    psVar4 = &in_RDX[1].len;
    local_128 = &local_320;
    pSVar6 = in_RDX;
    local_120 = psVar4;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
    ::al((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
          *)0x3fa448);
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
    ::alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
                *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               (StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL> *)in_stack_fffffffffffffbd8,
               (Type **)0x3fa465);
    x_01 = boost::unordered::detail::foa::
           alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
           ::value((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
                    *)0x3fa46f);
    local_70 = boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>::move(x_01)
    ;
    local_68 = psVar4;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
               ::key_from<slang::ast::Symbol_const*>((Symbol **)0x3fa4af);
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
               ::hash_for<slang::ast::Symbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                           *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                          (Symbol **)in_stack_fffffffffffffbd8);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                               *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                              (size_t)in_stack_fffffffffffffbd8);
    local_10 = local_78;
    local_20 = local_80;
    local_18 = local_88;
    local_8 = psVar4;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                 ::groups((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                           *)0x3fa591);
      local_40 = local_40 + local_38;
      uVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                      in_stack_fffffffffffffbe8,
                      CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      local_44 = uVar2;
      if (uVar2 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                   ::elements((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                               *)0x3fa5ea);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffbe8 =
               (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                       *)0x3fa63a);
          in_stack_fffffffffffffbf0 = local_10;
          in_stack_fffffffffffffbf8 =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
               ::key_from<slang::ast::Symbol_const*>((Symbol **)0x3fa664);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            ((equal_to<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffbe8,
                             in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_003fa76b;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      in_stack_fffffffffffffbe7 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (size_t)in_stack_fffffffffffffbd8);
      if ((bool)in_stack_fffffffffffffbe7) {
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
        ::table_locator(&local_a0);
        goto LAB_003fa76b;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)in_RDX[1].firstElement);
    } while (bVar1);
    memset(&local_a0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
    ::table_locator(&local_a0);
LAB_003fa76b:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                 ::make_iterator((locator *)0x3fa78b);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_338,&local_b0,&local_b1);
      in_RDX = pSVar6;
    }
    else if (*(ulong *)in_RDX[2].firstElement < in_RDX[2].cap) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_at<slang::ast::Symbol_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  *)CONCAT44(uVar2,in_stack_fffffffffffffc00),(size_t)in_stack_fffffffffffffbf8,
                 (size_t)in_stack_fffffffffffffbf0,(Symbol **)in_stack_fffffffffffffbe8);
      local_c8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                 ::make_iterator((locator *)0x3fa80d);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_338,&local_c8,local_e1);
      in_RDX = pSVar6;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                  *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48,x_01);
      local_f8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
                 ::make_iterator((locator *)0x3fa878);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_338,&local_f8,local_111);
      in_RDX = pSVar6;
    }
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
    ::~alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>,_const_slang::ast::Type_*&>
                *)0x3fa8ef);
    if ((local_338.second & 1U) != 0) {
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)
                 CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                 (Type **)in_stack_fffffffffffffbd8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
    ::operator++(&local_310);
  } while( true );
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}